

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<capnp::Capability::Client> * __thiscall
kj::_::NullableValue<capnp::Capability::Client>::operator=
          (NullableValue<capnp::Capability::Client> *this,
          NullableValue<capnp::Capability::Client> *other)

{
  Client *params;
  NullableValue<capnp::Capability::Client> *other_local;
  NullableValue<capnp::Capability::Client> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<capnp::Capability::Client>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<capnp::Capability::Client>(&(other->field_1).value);
      ctor<capnp::Capability::Client,capnp::Capability::Client>(&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }